

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* add_matrix<double>(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     *__return_storage_ptr__,
                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *a,vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       *b)

{
  double dVar1;
  double dVar2;
  size_type sVar3;
  const_reference pvVar4;
  size_type __n;
  const_reference pvVar5;
  reference this;
  reference pvVar6;
  int local_68;
  int local_64;
  int j;
  int i;
  allocator<double> local_49;
  vector<double,_std::allocator<double>_> local_48;
  undefined1 local_29;
  int local_28;
  int local_24;
  int m;
  int n;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *b_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *a_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *ans;
  
  _m = b;
  b_local = a;
  a_local = __return_storage_ptr__;
  sVar3 = std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::size(a);
  local_24 = (int)sVar3;
  pvVar4 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[](b_local,0);
  sVar3 = std::vector<double,_std::allocator<double>_>::size(pvVar4);
  local_28 = (int)sVar3;
  local_29 = 0;
  sVar3 = (size_type)local_24;
  __n = (size_type)local_28;
  std::allocator<double>::allocator(&local_49);
  std::vector<double,_std::allocator<double>_>::vector(&local_48,__n,&local_49);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)((long)&j + 3));
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(__return_storage_ptr__,sVar3,&local_48,
           (allocator<std::vector<double,_std::allocator<double>_>_> *)((long)&j + 3));
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)((long)&j + 3));
  std::vector<double,_std::allocator<double>_>::~vector(&local_48);
  std::allocator<double>::~allocator(&local_49);
  for (local_64 = 0; local_64 < local_24; local_64 = local_64 + 1) {
    for (local_68 = 0; local_68 < local_28; local_68 = local_68 + 1) {
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](b_local,(long)local_64);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_68);
      dVar1 = *pvVar5;
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](_m,(long)local_64);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)local_68);
      dVar2 = *pvVar5;
      this = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](__return_storage_ptr__,(long)local_64);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](this,(long)local_68);
      *pvVar6 = dVar1 + dVar2;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<T> > add_matrix(const std::vector<std::vector<T> >& a, const std::vector<std::vector<T> >& b){
    int n = a.size();
    int m = a[0].size();
    std::vector<std::vector<T> > ans(n, std::vector<T>(m));
    for (int i = 0; i < n; ++i)
        for (int j = 0; j < m; ++j)
            ans[i][j] = a[i][j] + b[i][j];
    return ans;
}